

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_key.cpp
# Opt level: O0

Privkey * __thiscall
cfd::api::KeyApi::GetPrivkey(KeyApi *this,string *privkey,NetType *net_type,bool *is_compressed)

{
  NetType *in_RCX;
  string *in_RDX;
  Privkey *in_RDI;
  byte *in_R8;
  bool has_wif;
  NetType temp_net_type;
  bool is_compress;
  Privkey *key;
  Privkey *in_stack_ffffffffffffff58;
  Privkey *this_00;
  Privkey local_88;
  Privkey local_68;
  undefined1 local_31;
  NetType local_30;
  bool local_2a [2];
  byte *local_28;
  NetType *local_20;
  string *local_18;
  
  local_2a[1] = false;
  this_00 = in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  core::Privkey::Privkey(in_RDI);
  local_2a[0] = true;
  local_30 = kMainnet;
  local_31 = core::Privkey::HasWif(local_18,&local_30,local_2a);
  if ((bool)local_31) {
    core::Privkey::FromWif(&local_68,local_18,local_30,(bool)(local_2a[0] & 1));
    core::Privkey::operator=(this_00,in_stack_ffffffffffffff58);
    core::Privkey::~Privkey((Privkey *)0x63f3fe);
    if (local_20 != (NetType *)0x0) {
      *local_20 = local_30;
    }
    if (local_28 != (byte *)0x0) {
      *local_28 = local_2a[0] & 1;
    }
  }
  else {
    core::Privkey::Privkey(&local_88,local_18,kMainnet,true);
    core::Privkey::operator=(this_00,in_stack_ffffffffffffff58);
    core::Privkey::~Privkey((Privkey *)0x63f485);
  }
  return in_RDI;
}

Assistant:

Privkey KeyApi::GetPrivkey(
    const std::string& privkey, NetType* net_type, bool* is_compressed) const {
  Privkey key;
  bool is_compress = true;
  NetType temp_net_type = NetType::kMainnet;

  bool has_wif = Privkey::HasWif(privkey, &temp_net_type, &is_compress);
  if (has_wif) {
    key = Privkey::FromWif(privkey, temp_net_type, is_compress);
    if (net_type != nullptr) *net_type = temp_net_type;
    if (is_compressed != nullptr) *is_compressed = is_compress;
  } else {
    key = Privkey(privkey);
  }
  return key;
}